

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O2

void __thiscall
QAccessibleTextEdit::scrollToSubstring(QAccessibleTextEdit *this,int startIndex,int endIndex)

{
  IfNotOldStyleArgs<bool,_QMetaMethodArgument> IVar1;
  int iVar2;
  int iVar3;
  QWidget *this_00;
  QScrollBar *pQVar4;
  int iVar5;
  Representation ray;
  int iVar6;
  long in_FS_OFFSET;
  QRect QVar7;
  QRect QVar8;
  QTextCursor cursor;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  char *local_58;
  QMetaMethodArgument local_50;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = QAccessibleWidget::widget((QAccessibleWidget *)this);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)&(this->super_QAccessibleTextWidget).super_QAccessibleWidget + 0x158))
            ((QTextCursor *)&local_38,this);
  iVar2 = (int)(QTextCursor *)&local_38;
  QTextCursor::setPosition(iVar2,startIndex);
  QVar7 = QTextEdit::cursorRect((QTextEdit *)this_00,(QTextCursor *)&local_38);
  QTextCursor::setPosition(iVar2,endIndex);
  QVar8 = QTextEdit::cursorRect((QTextEdit *)this_00,(QTextCursor *)&local_38);
  pQVar4 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this_00);
  iVar2 = QAbstractSlider::value(&pQVar4->super_QAbstractSlider);
  iVar5 = iVar2 + QVar7.x1.m_i.m_i;
  pQVar4 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this_00);
  iVar3 = QAbstractSlider::value(&pQVar4->super_QAbstractSlider);
  iVar6 = QVar7.y1.m_i.m_i + iVar3;
  local_70 = (double)iVar5;
  local_50.data = &local_70;
  uStack_68 = (double)iVar6;
  uStack_60 = (double)(((long)(QVar8.x2.m_i.m_i + iVar2) - (long)iVar5) + 1);
  local_58 = (char *)(double)(((long)(QVar8.y2.m_i.m_i + iVar3) - (long)iVar6) + 1);
  local_50.metaType = (QMetaTypeInterface *)&QtPrivate::QMetaTypeInterfaceWrapper<QRectF>::metaType;
  local_50.name = "QRectF";
  IVar1 = QMetaObject::invokeMethod<QMetaMethodArgument>
                    (&this_00->super_QObject,"_q_ensureVisible",&local_50);
  if (!IVar1) {
    local_70._0_4_ = 2;
    uStack_60._4_4_ = 0;
    local_70._4_4_ = 0;
    uStack_68._0_4_ = 0;
    uStack_68._4_4_ = 0;
    uStack_60._0_4_ = 0;
    local_58 = "default";
    QMessageLogger::warning((char *)&local_70,"AccessibleTextEdit::scrollToSubstring failed!");
  }
  QTextCursor::~QTextCursor((QTextCursor *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAccessibleTextEdit::scrollToSubstring(int startIndex, int endIndex)
{
    QTextEdit *edit = textEdit();

    QTextCursor cursor = textCursor();
    cursor.setPosition(startIndex);
    QRect r = edit->cursorRect(cursor);

    cursor.setPosition(endIndex);
    r.setBottomRight(edit->cursorRect(cursor).bottomRight());

    r.moveTo(r.x() + edit->horizontalScrollBar()->value(),
             r.y() + edit->verticalScrollBar()->value());

    // E V I L, but ensureVisible is not public
    if (Q_UNLIKELY(!QMetaObject::invokeMethod(edit, "_q_ensureVisible", Q_ARG(QRectF, r))))
        qWarning("AccessibleTextEdit::scrollToSubstring failed!");
}